

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result_opt_conflict * __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::gte_key_byte(iter_result_opt_conflict *__return_storage_ptr__,
              basic_inode_16<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              *this,byte key_byte)

{
  byte bVar1;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar2;
  uintptr_t uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    if ((this->
        super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ).
        super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        .children_count.value == uVar4) {
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix.u64 = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_engaged = 0;
      return __return_storage_ptr__;
    }
    bVar1 = *(byte *)((long)((this->children)._M_elems + -2) + uVar4);
    if (key_byte <= bVar1) break;
    uVar4 = uVar4 + 1;
  }
  uVar3 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I16);
  kVar2 = (this->
          super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ).
          super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          .k_prefix;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.key_byte = bVar1;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.child_index = (uint8_t)uVar4;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.prefix = (key_prefix_snapshot)kVar2;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_16::iter_result_opt
  gte_key_byte(std::byte key_byte) noexcept {
    const auto children_count_ = this->children_count.load();
    for (std::uint8_t i = 0; i < children_count_; ++i) {
      const auto key = keys.byte_array[i].load();
      if (key >= key_byte) {
        return {{node_ptr{this, node_type::I16}, key, i,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    // This should only occur if there is no entry in the keys[] which
    // is greater-than the given [key_byte].
    return parent_class::end_result;
  }